

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFanout.c
# Opt level: O2

void Ivy_ManStartFanout(Ivy_Man_t *p)

{
  Ivy_Obj_t *pFanout;
  int i;
  Ivy_Obj_t *pIVar1;
  
  if (p->fFanout == 0) {
    p->fFanout = 1;
    for (i = 0; i < p->vObjs->nSize; i = i + 1) {
      pFanout = (Ivy_Obj_t *)Vec_PtrEntry(p->vObjs,i);
      if (pFanout != (Ivy_Obj_t *)0x0) {
        pIVar1 = (Ivy_Obj_t *)((ulong)pFanout->pFanin0 & 0xfffffffffffffffe);
        if (pIVar1 != (Ivy_Obj_t *)0x0) {
          Ivy_ObjAddFanout(p,pIVar1,pFanout);
        }
        pIVar1 = (Ivy_Obj_t *)((ulong)pFanout->pFanin1 & 0xfffffffffffffffe);
        if (pIVar1 != (Ivy_Obj_t *)0x0) {
          Ivy_ObjAddFanout(p,pIVar1,pFanout);
        }
      }
    }
    return;
  }
  __assert_fail("!p->fFanout",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyFanout.c"
                ,0x8c,"void Ivy_ManStartFanout(Ivy_Man_t *)");
}

Assistant:

void Ivy_ManStartFanout( Ivy_Man_t * p )
{
    Ivy_Obj_t * pObj;
    int i;
    assert( !p->fFanout );
    p->fFanout = 1;
    Ivy_ManForEachObj( p, pObj, i )
    {
        if ( Ivy_ObjFanin0(pObj) )
            Ivy_ObjAddFanout( p, Ivy_ObjFanin0(pObj), pObj );
        if ( Ivy_ObjFanin1(pObj) )
            Ivy_ObjAddFanout( p, Ivy_ObjFanin1(pObj), pObj );
    }
}